

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_stdlib.c
# Opt level: O3

void glib_logger(gchar *log_domain,GLogLevelFlags log_level,gchar *message,gpointer user_data)

{
  int severity;
  
  if ((log_level & (G_LOG_LEVEL_DEBUG|G_LOG_LEVEL_INFO|G_LOG_LEVEL_MESSAGE)) ==
      ~(G_LOG_LEVEL_MASK|G_LOG_FLAG_FATAL|G_LOG_FLAG_RECURSION)) {
    severity = 3000;
    if ((log_level & G_LOG_LEVEL_WARNING) ==
        ~(G_LOG_LEVEL_MASK|G_LOG_FLAG_FATAL|G_LOG_FLAG_RECURSION)) {
      severity = 4000;
    }
    _p2sc_msg("glib_logger",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_stdlib.c"
              ,0x38,"$Id: p2sc_stdlib.c 5108 2014-06-19 12:29:23Z bogdan $",severity,"%s: %s",
              log_domain,message);
    if ((log_level & G_LOG_LEVEL_WARNING) ==
        ~(G_LOG_LEVEL_MASK|G_LOG_FLAG_FATAL|G_LOG_FLAG_RECURSION)) {
      exit(1);
    }
  }
  else {
    _p2sc_msg("glib_logger",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_stdlib.c"
              ,0x38,"$Id: p2sc_stdlib.c 5108 2014-06-19 12:29:23Z bogdan $",2000,"%s: %s",log_domain
              ,message);
  }
  return;
}

Assistant:

static void glib_logger(const gchar *log_domain, GLogLevelFlags log_level,
                        const gchar *message, gpointer user_data G_GNUC_UNUSED) {
    int level;

    if (log_level & (G_LOG_LEVEL_DEBUG | G_LOG_LEVEL_INFO | G_LOG_LEVEL_MESSAGE))
        level = LVL_MESSAGE;
    else if (log_level & G_LOG_LEVEL_WARNING)
        level = LVL_WARNING;
    else
        level = LVL_FATAL;

    P2SC_Msg(level, "%s: %s", log_domain, message);
}